

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

NESTresult * __thiscall
NEST::NESTcalc::FullCalculation
          (NESTresult *__return_storage_ptr__,NESTcalc *this,INTERACTION_TYPE species,double energy,
          double density,double dfield,double A,double Z,
          vector<double,_std::allocator<double>_> *NRYieldsParam,
          vector<double,_std::allocator<double>_> *NRERWidthsParam,
          vector<double,_std::allocator<double>_> *ERYieldsParam,bool do_times)

{
  int iVar1;
  allocator<double> local_101;
  value_type local_100;
  vector<double,_std::allocator<double>_> local_f8;
  photonstream local_e0;
  undefined8 local_c8;
  undefined8 local_c0;
  double local_b8;
  double local_b0;
  YieldResult local_98;
  undefined1 local_62;
  byte local_61;
  vector<double,_std::allocator<double>_> *pvStack_60;
  bool do_times_local;
  vector<double,_std::allocator<double>_> *ERYieldsParam_local;
  vector<double,_std::allocator<double>_> *NRERWidthsParam_local;
  vector<double,_std::allocator<double>_> *NRYieldsParam_local;
  double Z_local;
  double A_local;
  double dfield_local;
  double density_local;
  double energy_local;
  NESTcalc *pNStack_18;
  INTERACTION_TYPE species_local;
  NESTcalc *this_local;
  NESTresult *result;
  
  local_61 = do_times;
  pvStack_60 = ERYieldsParam;
  ERYieldsParam_local = NRERWidthsParam;
  NRERWidthsParam_local = NRYieldsParam;
  NRYieldsParam_local = (vector<double,_std::allocator<double>_> *)Z;
  Z_local = A;
  A_local = dfield;
  dfield_local = density;
  density_local = energy;
  energy_local._4_4_ = species;
  pNStack_18 = this;
  this_local = (NESTcalc *)__return_storage_ptr__;
  if (density < 1.0) {
    VDetector::set_inGas(this->fdetector,true);
  }
  local_62 = 0;
  NESTresult::NESTresult(__return_storage_ptr__);
  GetYields(&local_98,this,energy_local._4_4_,density_local,dfield_local,A_local,Z_local,
            (double)NRYieldsParam_local,NRERWidthsParam_local,pvStack_60);
  *(undefined4 *)&(__return_storage_ptr__->yields).ElectricField = local_98.ElectricField._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->yields).ElectricField + 4) =
       local_98.ElectricField._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->yields).DeltaT_Scint = local_98.DeltaT_Scint._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->yields).DeltaT_Scint + 4) =
       local_98.DeltaT_Scint._4_4_;
  (__return_storage_ptr__->yields).ExcitonRatio = local_98.ExcitonRatio;
  (__return_storage_ptr__->yields).Lindhard = local_98.Lindhard;
  (__return_storage_ptr__->yields).PhotonYield = local_98.PhotonYield;
  (__return_storage_ptr__->yields).ElectronYield = local_98.ElectronYield;
  (*this->_vptr_NESTcalc[0xc])
            (SUB84(dfield_local,0),0,&local_c8,this,__return_storage_ptr__,ERYieldsParam_local);
  (__return_storage_ptr__->quanta).photons = (undefined4)local_c8;
  (__return_storage_ptr__->quanta).electrons = local_c8._4_4_;
  (__return_storage_ptr__->quanta).ions = (undefined4)local_c0;
  (__return_storage_ptr__->quanta).excitons = local_c0._4_4_;
  (__return_storage_ptr__->quanta).recombProb = local_b8;
  (__return_storage_ptr__->quanta).Variance = local_b0;
  if ((local_61 & 1) == 0) {
    iVar1 = (__return_storage_ptr__->quanta).photons;
    local_100 = 0.0;
    std::allocator<double>::allocator(&local_101);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_f8,(long)iVar1,&local_100,&local_101);
    std::vector<double,_std::allocator<double>_>::operator=
              (&__return_storage_ptr__->photon_times,&local_f8);
    std::vector<double,_std::allocator<double>_>::~vector(&local_f8);
    std::allocator<double>::~allocator(&local_101);
  }
  else {
    GetPhotonTimes(&local_e0,this,energy_local._4_4_,(__return_storage_ptr__->quanta).photons,
                   (__return_storage_ptr__->quanta).excitons,A_local,density_local);
    std::vector<double,_std::allocator<double>_>::operator=
              (&__return_storage_ptr__->photon_times,&local_e0);
    std::vector<double,_std::allocator<double>_>::~vector(&local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

NESTresult NESTcalc::FullCalculation(INTERACTION_TYPE species, double energy,
                                     double density, double dfield, double A,
                                     double Z,
                                     const std::vector<double> &NRYieldsParam,
                                     const std::vector<double> &NRERWidthsParam,
                                     const std::vector<double> &ERYieldsParam,
                                     bool do_times /*=true*/) {
  if (density < 1.) fdetector->set_inGas(true);
  NESTresult result;
  result.yields = GetYields(species, energy, density, dfield, A, Z,
                            NRYieldsParam, ERYieldsParam);
  result.quanta =
      GetQuanta(result.yields, density, NRERWidthsParam, -999.);
  if (do_times)
    result.photon_times = GetPhotonTimes(
        species, result.quanta.photons, result.quanta.excitons, dfield, energy);
  else {
    result.photon_times = photonstream(result.quanta.photons, 0.0);
  }
  return result;
}